

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void estimate_space_upto_test(bool multi_kv)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  char cVar9;
  fdb_kvs_handle **ptr_handle;
  undefined7 in_register_00000039;
  ulong uVar10;
  long lVar11;
  long lVar12;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  int local_dec;
  fdb_kvs_handle *local_de8 [4];
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_doc *local_998 [301];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x32;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0;
  fconfig.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  local_dec = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_dec == 0) {
    fdb_kvs_open_default(dbfile,local_de8,&kvs_config);
    lVar8 = 1;
  }
  else {
    ptr_handle = local_de8;
    lVar8 = 4;
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      sprintf(kv_name,"kv%d",uVar10 & 0xffffffff);
      fdb_kvs_open(dbfile,ptr_handle,kv_name,&kvs_config);
      ptr_handle = ptr_handle + 1;
    }
  }
  for (uVar10 = 0; uVar10 != 0x4b; uVar10 = uVar10 + 1) {
    sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_998 + uVar10,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      fdb_set(local_de8[lVar11],local_998[uVar10]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar10 = 0x4b; uVar10 != 0x96; uVar10 = uVar10 + 1) {
    sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_998 + uVar10,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      fdb_set(local_de8[lVar11],local_998[uVar10]);
    }
  }
  for (lVar11 = 0; lVar11 != 0x4b; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
      fdb_set(local_de8[lVar12],local_998[lVar11]);
    }
  }
  for (lVar11 = 0; lVar11 != 0x4b; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
      fdb_set(local_de8[lVar12],local_998[lVar11]);
    }
  }
  fdb_commit(dbfile,'\0');
  for (uVar10 = 0x96; uVar10 != 0xe1; uVar10 = uVar10 + 1) {
    sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_998 + uVar10,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      fdb_set(local_de8[lVar11],local_998[uVar10]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar10 = 0xe1; uVar10 != 300; uVar10 = uVar10 + 1) {
    sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_998 + uVar10,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      fdb_set(local_de8[lVar11],local_998[uVar10]);
    }
  }
  lVar11 = 0;
  fdb_commit(dbfile,'\0');
  while (lVar8 != lVar11) {
    fVar1 = fdb_set_log_callback(local_de8[lVar11],logCallbackFunc,"estimate_space_upto_test");
    lVar11 = lVar11 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x35d);
      estimate_space_upto_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x35d,"void estimate_space_upto_test(bool)");
    }
  }
  fVar1 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x361);
    estimate_space_upto_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x361,"void estimate_space_upto_test(bool)");
  }
  cVar9 = (char)local_dec;
  if (cVar9 == '\0') {
    if (num_markers != 4) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x365);
      estimate_space_upto_test(bool)::__test_pass = '\x01';
      if (num_markers != 4) {
        __assert_fail("num_markers == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x365,"void estimate_space_upto_test(bool)");
      }
    }
    sVar5 = fdb_estimate_space_used_from(dbfile,markers[1].marker);
    sVar6 = fdb_estimate_space_used_from(dbfile,markers[2].marker);
    if (sVar6 <= sVar5) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x368);
      estimate_space_upto_test(bool)::__test_pass = 1;
      __assert_fail("space_used2 > space_used",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x368,"void estimate_space_upto_test(bool)");
    }
  }
  else {
    if (num_markers != 8) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x36b);
      estimate_space_upto_test(bool)::__test_pass = '\x01';
      if (num_markers != 8) {
        __assert_fail("num_markers == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x36b,"void estimate_space_upto_test(bool)");
      }
    }
    sVar5 = fdb_estimate_space_used_from(dbfile,markers[1].marker);
    sVar6 = fdb_estimate_space_used_from(dbfile,markers[2].marker);
    if (sVar6 <= sVar5) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x36e);
      estimate_space_upto_test(bool)::__test_pass = 1;
      __assert_fail("space_used2 > space_used",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x36e,"void estimate_space_upto_test(bool)");
    }
  }
  fVar1 = fdb_free_snap_markers(markers,num_markers);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_close(dbfile);
    for (lVar8 = 0; lVar8 != 300; lVar8 = lVar8 + 1) {
      fdb_doc_free(local_998[lVar8]);
    }
    fdb_shutdown();
    memleak_end();
    pcVar7 = "single kv mode:";
    if (cVar9 != '\0') {
      pcVar7 = "multiple kv mode:";
    }
    sprintf(bodybuf,"estimate space upto marker in file test %s",pcVar7);
    pcVar7 = "%s PASSED\n";
    if (estimate_space_upto_test(bool)::__test_pass != '\0') {
      pcVar7 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar7,bodybuf);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x372);
  estimate_space_upto_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x372,"void estimate_space_upto_test(bool)");
}

Assistant:

void estimate_space_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 300;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;
    size_t space_used;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 50;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert first quarter of documents
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert second quarter of documents
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // Update first quarter of documents again..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }
    // Update first quarter of documents again overwriting previous update..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }

    // commit again without a WAL flush (some of these docs remain in WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert third quarter of documents
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert fourth quarter of documents
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush (some of these docs remain in the WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "estimate_space_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        size_t space_used2;
        TEST_CHK(num_markers == 4);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    } else {
        size_t space_used2;
        TEST_CHK(num_markers == 8);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "estimate space upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}